

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O0

uint64_t __thiscall fast_float::bigint::hi64(bigint *this,bool *truncated)

{
  ulong uVar1;
  long lVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  size_t sVar6;
  ulong *puVar7;
  int __c;
  int __c_00;
  uint64_t result;
  bool *truncated_local;
  bigint *this_local;
  int shl;
  int shr;
  int shl_1;
  bigint *local_18;
  
  sVar6 = stackvec<(unsigned_short)62>::len(&this->vec);
  if (sVar6 == 0) {
    *truncated = false;
    this_local = (bigint *)0x0;
  }
  else {
    sVar6 = stackvec<(unsigned_short)62>::len(&this->vec);
    if (sVar6 == 1) {
      puVar7 = (ulong *)stackvec<(unsigned_short)62>::rindex(&this->vec,(char *)0x0,__c);
      uVar1 = *puVar7;
      *truncated = false;
      if (uVar1 == 0) {
        __assert_fail("input_num > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/fast_float/include/fast_float/float_common.h"
                      ,0xeb,"int fast_float::leading_zeroes(uint64_t)");
      }
      lVar2 = 0x3f;
      if (uVar1 != 0) {
        for (; uVar1 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      this_local = (bigint *)(uVar1 << (((byte)lVar2 ^ 0x3f) & 0x3f));
    }
    else {
      puVar7 = (ulong *)stackvec<(unsigned_short)62>::rindex(&this->vec,(char *)0x0,__c);
      local_18 = (bigint *)*puVar7;
      puVar7 = (ulong *)stackvec<(unsigned_short)62>::rindex(&this->vec,(char *)0x1,__c_00);
      uVar1 = *puVar7;
      if (local_18 == (bigint *)0x0) {
        __assert_fail("input_num > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/fast_float/include/fast_float/float_common.h"
                      ,0xeb,"int fast_float::leading_zeroes(uint64_t)");
      }
      lVar2 = 0x3f;
      if (local_18 != (bigint *)0x0) {
        for (; (ulong)local_18 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      uVar5 = (uint)lVar2 ^ 0x3f;
      if (uVar5 == 0) {
        *truncated = uVar1 != 0;
      }
      else {
        bVar3 = (byte)uVar5;
        *truncated = uVar1 << (bVar3 & 0x3f) != 0;
        local_18 = (bigint *)((long)local_18 << (bVar3 & 0x3f) | uVar1 >> (0x40 - bVar3 & 0x3f));
      }
      bVar4 = stackvec<(unsigned_short)62>::nonzero(&this->vec,2);
      *truncated = (*truncated & 1U) != 0 || bVar4;
      this_local = local_18;
    }
  }
  return (uint64_t)this_local;
}

Assistant:

FASTFLOAT_CONSTEXPR20 uint64_t hi64(bool& truncated) const noexcept {
#ifdef FASTFLOAT_64BIT_LIMB
    if (vec.len() == 0) {
      return empty_hi64(truncated);
    } else if (vec.len() == 1) {
      return uint64_hi64(vec.rindex(0), truncated);
    } else {
      uint64_t result = uint64_hi64(vec.rindex(0), vec.rindex(1), truncated);
      truncated |= vec.nonzero(2);
      return result;
    }
#else
    if (vec.len() == 0) {
      return empty_hi64(truncated);
    } else if (vec.len() == 1) {
      return uint32_hi64(vec.rindex(0), truncated);
    } else if (vec.len() == 2) {
      return uint32_hi64(vec.rindex(0), vec.rindex(1), truncated);
    } else {
      uint64_t result = uint32_hi64(vec.rindex(0), vec.rindex(1), vec.rindex(2), truncated);
      truncated |= vec.nonzero(3);
      return result;
    }
#endif
  }